

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O1

bool __thiscall File::readAll(File *this,String *data)

{
  usize uVar1;
  
  uVar1 = size(this);
  if (-1 < (long)uVar1) {
    String::detach(data,uVar1,uVar1);
    uVar1 = data->data->len;
    String::detach(data,uVar1,uVar1);
    uVar1 = ::read(*(int *)&this->fp,data->data->str,data->data->len);
    if (-1 < (long)uVar1) {
      String::detach(data,uVar1,uVar1);
      return true;
    }
    String::clear(data);
  }
  return false;
}

Assistant:

bool File::readAll(String& data)
{
  int64 fileSize = size();
  if(fileSize < 0)
    return false;
  data.resize((usize)fileSize);
  ssize dataCount = read((char*)data, data.length());
  if(dataCount < 0)
  {
    data.clear();
    return false;
  }
  data.resize(dataCount);
  return true;
}